

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O3

uint64_t search_one(int *lev,int nb_strengths,uint64_t (*mse) [64],int sb_count,
                   CDEF_PICK_METHOD pick_method)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t (*pauVar4) [64];
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t tot_mse [64];
  ulong local_238 [65];
  
  uVar9 = 0x8000000000000000;
  uVar1 = nb_cdef_strengths[pick_method];
  uVar8 = 0;
  memset(local_238,0,0x200);
  if (0 < sb_count) {
    uVar2 = 1;
    if (1 < (int)uVar1) {
      uVar2 = (ulong)uVar1;
    }
    uVar3 = 0;
    pauVar4 = mse;
    do {
      uVar5 = 0x8000000000000000;
      if (0 < nb_strengths) {
        uVar6 = 0;
        uVar5 = 0x8000000000000000;
        do {
          if (mse[uVar3][lev[uVar6]] < uVar5) {
            uVar5 = mse[uVar3][lev[uVar6]];
          }
          uVar6 = uVar6 + 1;
        } while ((uint)nb_strengths != uVar6);
      }
      uVar6 = 0;
      do {
        uVar7 = (*pauVar4)[uVar6];
        if (uVar5 <= (*pauVar4)[uVar6]) {
          uVar7 = uVar5;
        }
        local_238[uVar6] = local_238[uVar6] + uVar7;
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
      uVar3 = uVar3 + 1;
      pauVar4 = pauVar4 + 1;
    } while (uVar3 != (uint)sb_count);
  }
  uVar2 = 1;
  if (1 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  uVar3 = 0;
  do {
    if (local_238[uVar3] < uVar9) {
      uVar8 = uVar3 & 0xffffffff;
      uVar9 = local_238[uVar3];
    }
    uVar3 = uVar3 + 1;
  } while (uVar2 != uVar3);
  lev[nb_strengths] = (int)uVar8;
  return uVar9;
}

Assistant:

static uint64_t search_one(int *lev, int nb_strengths,
                           uint64_t mse[][TOTAL_STRENGTHS], int sb_count,
                           CDEF_PICK_METHOD pick_method) {
  uint64_t tot_mse[TOTAL_STRENGTHS];
  const int total_strengths = nb_cdef_strengths[pick_method];
  int i, j;
  uint64_t best_tot_mse = (uint64_t)1 << 63;
  int best_id = 0;
  memset(tot_mse, 0, sizeof(tot_mse));
  for (i = 0; i < sb_count; i++) {
    int gi;
    uint64_t best_mse = (uint64_t)1 << 63;
    /* Find best mse among already selected options. */
    for (gi = 0; gi < nb_strengths; gi++) {
      if (mse[i][lev[gi]] < best_mse) {
        best_mse = mse[i][lev[gi]];
      }
    }
    /* Find best mse when adding each possible new option. */
    for (j = 0; j < total_strengths; j++) {
      uint64_t best = best_mse;
      if (mse[i][j] < best) best = mse[i][j];
      tot_mse[j] += best;
    }
  }
  for (j = 0; j < total_strengths; j++) {
    if (tot_mse[j] < best_tot_mse) {
      best_tot_mse = tot_mse[j];
      best_id = j;
    }
  }
  lev[nb_strengths] = best_id;
  return best_tot_mse;
}